

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_deserializer.hpp
# Opt level: O2

unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>,_true>
__thiscall
duckdb::BinaryDeserializer::Deserialize<duckdb::ExtensionInstallInfo>(BinaryDeserializer *this)

{
  BinaryDeserializer *in_RSI;
  
  OnObjectBegin(in_RSI);
  ExtensionInstallInfo::Deserialize((ExtensionInstallInfo *)this,&in_RSI->super_Deserializer);
  OnObjectEnd(in_RSI);
  return (unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
          )(unique_ptr<duckdb::ExtensionInstallInfo,_std::default_delete<duckdb::ExtensionInstallInfo>_>
            )this;
}

Assistant:

unique_ptr<T> Deserialize() {
		OnObjectBegin();
		auto result = T::Deserialize(*this);
		OnObjectEnd();
		D_ASSERT(nesting_level == 0); // make sure we are at the root level
		return result;
	}